

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

double __thiscall flexbuffers::Reference::AsDouble(Reference *this)

{
  byte bVar1;
  long *plVar2;
  ulong *puVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  uint8_t *local_30;
  Vector local_28;
  
  dVar8 = 0.0;
  switch(this->type_) {
  case FBT_INT:
    plVar2 = (long *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        lVar7 = (long)(char)*plVar2;
      }
      else {
        lVar7 = (long)(short)*plVar2;
      }
    }
    else if (bVar1 < 8) {
      lVar7 = (long)(int)*plVar2;
    }
    else {
      lVar7 = *plVar2;
    }
    goto LAB_0014dccb;
  case FBT_FLOAT:
    pdVar4 = (double *)this->data_;
    bVar1 = this->parent_width_;
    if (3 < bVar1) {
      if (bVar1 < 8) {
        return (double)*(float *)pdVar4;
      }
      return *pdVar4;
    }
    if (bVar1 < 2) {
      iVar5 = (int)*(char *)pdVar4;
    }
    else {
      iVar5 = (int)*(short *)pdVar4;
    }
    goto LAB_0014dc76;
  case FBT_KEY:
  case FBT_MAP:
    goto switchD_0014da7b_caseD_4;
  case FBT_STRING:
    AsString((String *)&local_28,this);
    if (local_28.super_Sized.super_Object.data_ == (uint8_t *)0x0) {
      __assert_fail("str && val",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x138,
                    "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]");
    }
    local_30 = local_28.super_Sized.super_Object.data_;
    dVar8 = strtod_l((char *)local_28.super_Sized.super_Object.data_,(char **)&local_30,
                     flatbuffers::ClassicLocale::instance_);
    if (local_30 == local_28.super_Sized.super_Object.data_) {
      return 0.0;
    }
    if (*local_30 != '\0') {
      return 0.0;
    }
    if (!NAN(dVar8)) {
      return dVar8;
    }
    return NAN;
  case FBT_INDIRECT_INT:
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)(byte)*puVar3;
      }
      else {
        uVar6 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)(uint)*puVar3;
    }
    else {
      uVar6 = *puVar3;
    }
    lVar7 = -uVar6;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        lVar7 = (long)*(char *)((long)puVar3 + lVar7);
      }
      else {
        lVar7 = (long)*(short *)((long)puVar3 + lVar7);
      }
    }
    else if (bVar1 < 8) {
      lVar7 = (long)*(int *)((long)puVar3 + lVar7);
    }
    else {
      lVar7 = *(long *)((long)puVar3 + lVar7);
    }
LAB_0014dccb:
    return (double)lVar7;
  case FBT_INDIRECT_UINT:
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)(byte)*puVar3;
      }
      else {
        uVar6 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)(uint)*puVar3;
    }
    else {
      uVar6 = *puVar3;
    }
    lVar7 = -uVar6;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        local_28.super_Sized.size_ = (size_t)*(byte *)((long)puVar3 + lVar7);
      }
      else {
        local_28.super_Sized.size_ = (size_t)*(ushort *)((long)puVar3 + lVar7);
      }
    }
    else if (bVar1 < 8) {
      local_28.super_Sized.size_ = (size_t)*(uint *)((long)puVar3 + lVar7);
    }
    else {
      local_28.super_Sized.size_ = *(ulong *)((long)puVar3 + lVar7);
    }
    break;
  case FBT_INDIRECT_FLOAT:
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)(byte)*puVar3;
      }
      else {
        uVar6 = (ulong)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)(uint)*puVar3;
    }
    else {
      uVar6 = *puVar3;
    }
    lVar7 = -uVar6;
    bVar1 = this->byte_width_;
    if (3 < bVar1) {
      if (bVar1 < 8) {
        return (double)*(float *)((long)puVar3 + lVar7);
      }
      return *(double *)((long)puVar3 + lVar7);
    }
    if (bVar1 < 2) {
      iVar5 = (int)*(char *)((long)puVar3 + lVar7);
    }
    else {
      iVar5 = (int)*(short *)((long)puVar3 + lVar7);
    }
LAB_0014dc76:
    return (double)iVar5;
  case FBT_VECTOR:
    AsVector(&local_28,this);
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0.0;
    }
  case FBT_UINT:
    puVar3 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        local_28.super_Sized.size_ = (size_t)(byte)*puVar3;
      }
      else {
        local_28.super_Sized.size_ = (size_t)(ushort)*puVar3;
      }
    }
    else if (bVar1 < 8) {
      local_28.super_Sized.size_ = (size_t)(uint)*puVar3;
    }
    else {
      local_28.super_Sized.size_ = *puVar3;
    }
  }
  auVar9._8_4_ = (int)(local_28.super_Sized.size_ >> 0x20);
  auVar9._0_8_ = local_28.super_Sized.size_;
  auVar9._12_4_ = 0x45300000;
  dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_28.super_Sized.size_) - 4503599627370496.0);
switchD_0014da7b_caseD_4:
  return dVar8;
}

Assistant:

double AsDouble() const {
    if (type_ == FBT_FLOAT) {
      // A fast path for the common case.
      return ReadDouble(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_FLOAT: return ReadDouble(Indirect(), byte_width_);
        case FBT_INT:
          return static_cast<double>(ReadInt64(data_, parent_width_));
        case FBT_UINT:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        case FBT_INDIRECT_INT:
          return static_cast<double>(ReadInt64(Indirect(), byte_width_));
        case FBT_INDIRECT_UINT:
          return static_cast<double>(ReadUInt64(Indirect(), byte_width_));
        case FBT_NULL: return 0.0;
        case FBT_STRING: {
          double d;
          flatbuffers::StringToNumber(AsString().c_str(), &d);
          return d;
        }
        case FBT_VECTOR: return static_cast<double>(AsVector().size());
        case FBT_BOOL:
          return static_cast<double>(ReadUInt64(data_, parent_width_));
        default:
          // Convert strings and other things to float.
          return 0;
      }
  }